

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorFactory.cpp
# Opt level: O1

shared_ptr<adios2::core::Operator> __thiscall
adios2::core::MakeOperator(core *this,string *type,Params *parameters)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  size_type *psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  shared_ptr<adios2::core::Operator> sVar8;
  string typeLowerCase;
  string local_f8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  helper::LowerCase<std::__cxx11::string>(&local_d0,(helper *)type,(string *)parameters);
  iVar3 = std::__cxx11::string::compare((char *)&local_d0);
  _Var7._M_pi = extraout_RDX;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_d0);
    _Var7._M_pi = extraout_RDX_00;
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_d0);
      _Var7._M_pi = extraout_RDX_01;
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&local_d0);
        _Var7._M_pi = extraout_RDX_02;
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)&local_d0);
          _Var7._M_pi = extraout_RDX_03;
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)&local_d0);
            _Var7._M_pi = extraout_RDX_04;
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::string::compare((char *)&local_d0);
              if (iVar3 == 0) {
                local_f8._M_dataplus._M_p = (pointer)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<adios2::core::compress::CompressPNG,std::allocator<adios2::core::compress::CompressPNG>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length,
                           (CompressPNG **)&local_f8,
                           (allocator<adios2::core::compress::CompressPNG> *)&local_b0,parameters);
                _Var7._M_pi = extraout_RDX_08;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&local_d0);
                if (iVar3 == 0) {
                  local_f8._M_dataplus._M_p = (pointer)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<adios2::core::compress::CompressSirius,std::allocator<adios2::core::compress::CompressSirius>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_f8._M_string_length,(CompressSirius **)&local_f8,
                             (allocator<adios2::core::compress::CompressSirius> *)&local_b0,
                             parameters);
                  _Var7._M_pi = extraout_RDX_09;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)&local_d0);
                  _Var7._M_pi = extraout_RDX_05;
                  if (iVar3 == 0) goto LAB_003f83cd;
                  iVar3 = std::__cxx11::string::compare((char *)&local_d0);
                  _Var7._M_pi = extraout_RDX_06;
                  if (iVar3 == 0) goto LAB_003f83cd;
                  iVar3 = std::__cxx11::string::compare((char *)&local_d0);
                  _Var7._M_pi = extraout_RDX_07;
                  if (iVar3 == 0) goto LAB_003f83cd;
                  iVar3 = std::__cxx11::string::compare((char *)&local_d0);
                  if (iVar3 == 0) {
                    local_f8._M_dataplus._M_p = (pointer)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<adios2::plugin::PluginOperator,std::allocator<adios2::plugin::PluginOperator>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               &local_f8._M_string_length,(PluginOperator **)&local_f8,
                               (allocator<adios2::plugin::PluginOperator> *)&local_b0,parameters);
                    _Var7._M_pi = extraout_RDX_19;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)&local_d0);
                    if (iVar3 != 0) {
                      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f8,"Operator","");
                      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_b0,"OperatorFactory","");
                      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_70,"MakeOperator","");
                      std::operator+(&local_50,"ADIOS2 does not support ",&local_d0);
                      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
                      psVar6 = (size_type *)(plVar4 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar4 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar6) {
                        local_90.field_2._M_allocated_capacity = *psVar6;
                        local_90.field_2._8_8_ = plVar4[3];
                        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                      }
                      else {
                        local_90.field_2._M_allocated_capacity = *psVar6;
                        local_90._M_dataplus._M_p = (pointer)*plVar4;
                      }
                      local_90._M_string_length = plVar4[1];
                      *plVar4 = (long)psVar6;
                      plVar4[1] = 0;
                      *(undefined1 *)(plVar4 + 2) = 0;
                      helper::Throw<std::invalid_argument>
                                (&local_f8,&local_b0,&local_70,&local_90,-1);
                      _Var7._M_pi = extraout_RDX_21;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_90._M_dataplus._M_p != &local_90.field_2) {
                        operator_delete(local_90._M_dataplus._M_p);
                        _Var7._M_pi = extraout_RDX_22;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p);
                        _Var7._M_pi = extraout_RDX_23;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_70._M_dataplus._M_p != &local_70.field_2) {
                        operator_delete(local_70._M_dataplus._M_p);
                        _Var7._M_pi = extraout_RDX_24;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                        operator_delete(local_b0._M_dataplus._M_p);
                        _Var7._M_pi = extraout_RDX_25;
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                        operator_delete(local_f8._M_dataplus._M_p);
                        _Var7._M_pi = extraout_RDX_26;
                      }
                      goto LAB_003f83cd;
                    }
                    local_f8._M_dataplus._M_p = (pointer)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<adios2::core::compress::CompressNull,std::allocator<adios2::core::compress::CompressNull>,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&>
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               &local_f8._M_string_length,(CompressNull **)&local_f8,
                               (allocator<adios2::core::compress::CompressNull> *)&local_b0,
                               parameters);
                    _Var7._M_pi = extraout_RDX_20;
                  }
                }
              }
              sVar2 = local_f8._M_string_length;
              _Var1._M_p = local_f8._M_dataplus._M_p;
              local_f8._M_dataplus._M_p = (pointer)0x0;
              local_f8._M_string_length = 0;
              this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
              *(pointer *)this = _Var1._M_p;
              *(size_type *)(this + 8) = sVar2;
              if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                _Var7._M_pi = extraout_RDX_10;
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._M_string_length
                          );
                _Var7._M_pi = extraout_RDX_11;
              }
            }
          }
        }
      }
    }
  }
LAB_003f83cd:
  if (*(long *)this == 0) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Operator","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"OperatorFactory","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"MakeOperator","");
    std::operator+(&local_50,"ADIOS2 didn\'t compile with ",&local_d0);
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    psVar6 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90.field_2._8_8_ = puVar5[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar6;
      local_90._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_90._M_string_length = puVar5[1];
    *puVar5 = psVar6;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    helper::Throw<std::invalid_argument>(&local_f8,&local_b0,&local_70,&local_90,-1);
    _Var7._M_pi = extraout_RDX_12;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
      _Var7._M_pi = extraout_RDX_13;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
      _Var7._M_pi = extraout_RDX_14;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
      _Var7._M_pi = extraout_RDX_15;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
      _Var7._M_pi = extraout_RDX_16;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
      _Var7._M_pi = extraout_RDX_17;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
    _Var7._M_pi = extraout_RDX_18;
  }
  sVar8.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  sVar8.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<adios2::core::Operator>)
         sVar8.super___shared_ptr<adios2::core::Operator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Operator> MakeOperator(const std::string &type, const Params &parameters)
{
    std::shared_ptr<Operator> ret = nullptr;

    const std::string typeLowerCase = helper::LowerCase(type);

    if (typeLowerCase == "bigwhoop")
    {
#ifdef ADIOS2_HAVE_BIGWHOOP
        ret = std::make_shared<compress::CompressBigWhoop>(parameters);
#endif
    }
    else if (typeLowerCase == "blosc")
    {
#ifdef ADIOS2_HAVE_BLOSC2
        ret = std::make_shared<compress::CompressBlosc>(parameters);
#endif
    }
    else if (typeLowerCase == "bzip2")
    {
#ifdef ADIOS2_HAVE_BZIP2
        ret = std::make_shared<compress::CompressBZIP2>(parameters);
#endif
    }
    else if (typeLowerCase == "libpressio")
    {
#ifdef ADIOS2_HAVE_LIBPRESSIO
        ret = std::make_shared<compress::CompressLibPressio>(parameters);
#endif
    }
    else if (typeLowerCase == "mgard")
    {
#ifdef ADIOS2_HAVE_MGARD
        ret = std::make_shared<compress::CompressMGARD>(parameters);
#endif
    }
    else if (typeLowerCase == "mgardplus")
    {
#ifdef ADIOS2_HAVE_MGARD
        ret = std::make_shared<compress::CompressMGARDPlus>(parameters);
#endif
    }
    else if (typeLowerCase == "png")
    {
#ifdef ADIOS2_HAVE_PNG
        ret = std::make_shared<compress::CompressPNG>(parameters);
#endif
    }
    else if (typeLowerCase == "sirius")
    {
#ifdef ADIOS2_HAVE_MHS
        ret = std::make_shared<compress::CompressSirius>(parameters);
#endif
    }
    else if (typeLowerCase == "sz")
    {
#ifdef ADIOS2_HAVE_SZ
        ret = std::make_shared<compress::CompressSZ>(parameters);
#endif
    }
    else if (typeLowerCase == "zfp")
    {
#ifdef ADIOS2_HAVE_ZFP
        ret = std::make_shared<compress::CompressZFP>(parameters);
#endif
    }
    else if (typeLowerCase == "mdr")
    {
#ifdef ADIOS2_HAVE_MGARD_MDR
        ret = std::make_shared<refactor::RefactorMDR>(parameters);
#endif
    }
    else if (typeLowerCase == "plugin")
    {
        ret = std::make_shared<plugin::PluginOperator>(parameters);
    }
    else if (typeLowerCase == "null")
    {
        ret = std::make_shared<compress::CompressNull>(parameters);
    }
    else
    {
        helper::Throw<std::invalid_argument>("Operator", "OperatorFactory", "MakeOperator",
                                             "ADIOS2 does not support " + typeLowerCase +
                                                 " operation");
    }

    if (ret == nullptr)
    {
        helper::Throw<std::invalid_argument>("Operator", "OperatorFactory", "MakeOperator",
                                             "ADIOS2 didn't compile with " + typeLowerCase +
                                                 " library, operator not added");
    }

    return ret;
}